

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FC_BPNN.cpp
# Opt level: O0

bool __thiscall FC_BPNN::setSample(FC_BPNN *this,vector<double,_std::allocator<double>_> *sample)

{
  value_type vVar1;
  size_type sVar2;
  reference pvVar3;
  size_type sVar4;
  ostream *this_00;
  const_reference pvVar5;
  reference pvVar6;
  int local_24;
  int j;
  vector<double,_std::allocator<double>_> *sample_local;
  FC_BPNN *this_local;
  
  sVar2 = std::vector<double,_std::allocator<double>_>::size(sample);
  pvVar3 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::front(&this->layers_value);
  sVar4 = std::vector<double,_std::allocator<double>_>::size(pvVar3);
  if (sVar2 == sVar4) {
    local_24 = 0;
    while( true ) {
      pvVar3 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->layers_value,0);
      sVar2 = std::vector<double,_std::allocator<double>_>::size(pvVar3);
      if (sVar2 <= (ulong)(long)local_24) break;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](sample,(long)local_24);
      vVar1 = *pvVar5;
      pvVar3 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->layers_value,0);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,(long)local_24);
      *pvVar6 = vVar1;
      local_24 = local_24 + 1;
    }
    this_local._7_1_ = true;
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cerr,"Error input!");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FC_BPNN::setSample(const std::vector<double>& sample)
{
	if (sample.size() != layers_value.front().size()) {
		std::cerr << "Error input!" << std::endl;
		return false;
	}
	for (int j = 0; j < layers_value[0].size(); j++) {
		layers_value[0][j] = sample[j];
	}
	return true;
}